

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context_conflict *context,stbrp_rect_conflict *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  stbrp_node_conflict *psVar3;
  stbrp_context_conflict *psVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  long extraout_RAX;
  long lVar9;
  ulong uVar10;
  int iVar11;
  stbrp_context_conflict *psVar12;
  stbrp_rect_conflict *psVar13;
  stbrp_node_conflict *psVar14;
  stbrp_node_conflict **in_R8;
  stbrp_node_conflict *psVar15;
  uint uVar16;
  stbrp_node_conflict **ppsVar17;
  ulong uVar18;
  stbrp_node_conflict **ppsVar19;
  stbrp_context_conflict *psVar20;
  int iVar21;
  bool bVar22;
  int waste;
  int local_98;
  uint local_94;
  stbrp_node_conflict **local_90;
  int local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  stbrp_context_conflict *local_68;
  size_t local_60;
  stbrp_node_conflict **local_58;
  ulong local_50;
  stbrp_rect_conflict *local_48;
  stbrp_rect_conflict *local_40;
  ulong local_38;
  
  uVar18 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    piVar6 = &rects->was_packed;
    uVar10 = 0;
    do {
      *piVar6 = (int)uVar10;
      uVar10 = uVar10 + 1;
      piVar6 = piVar6 + 4;
    } while (uVar18 != uVar10);
  }
  local_60 = (size_t)num_rects;
  qsort(rects,local_60,0x10,rect_height_compare);
  if (0 < num_rects) {
    ppsVar17 = &context->active_head;
    uVar10 = 0;
    local_68 = context;
    local_58 = ppsVar17;
    local_50 = uVar18;
    local_48 = rects;
    do {
      psVar13 = rects + uVar10;
      uVar1 = rects[uVar10].w;
      uVar7 = (ulong)uVar1;
      if (uVar1 == 0) {
LAB_001d134a:
        psVar13->x = 0;
        psVar13->y = 0;
      }
      else {
        uVar2 = psVar13->h;
        local_78 = (ulong)uVar2;
        if (uVar2 == 0) goto LAB_001d134a;
        iVar11 = context->align;
        iVar21 = (uint)uVar1 + iVar11 + -1;
        iVar21 = iVar21 - iVar21 % iVar11;
        local_70 = uVar7;
        if (iVar21 % iVar11 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_rectpack.h"
                        ,0x168,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        if ((context->width < iVar21) || (context->height < (int)(uint)uVar2)) {
          uVar8 = 0;
          in_R8 = (stbrp_node_conflict **)0x0;
        }
        else {
          uVar1 = (ushort)((stbrp_context_conflict *)*ppsVar17)->width;
          local_40 = psVar13;
          local_38 = uVar10;
          if (context->width < (int)(iVar21 + (uint)uVar1)) {
            local_98 = 0x40000000;
            iVar11 = 0x40000000;
            local_90 = (stbrp_node_conflict **)0x0;
          }
          else {
            iVar11 = 0x40000000;
            local_90 = (stbrp_node_conflict **)0x0;
            local_98 = 0x40000000;
            psVar12 = (stbrp_context_conflict *)*ppsVar17;
            ppsVar19 = ppsVar17;
            do {
              iVar5 = stbrp__skyline_find_min_y
                                (psVar12,(stbrp_node_conflict *)(ulong)uVar1,iVar21,(int)&local_7c,
                                 (int *)in_R8);
              if (context->heuristic == 0) {
                if (iVar5 < iVar11) {
                  local_90 = ppsVar19;
                  iVar11 = iVar5;
                }
              }
              else if (((int)local_78 + iVar5 <= context->height) &&
                      ((iVar5 < iVar11 || ((iVar5 == iVar11 && (local_7c < local_98)))))) {
                local_98 = local_7c;
                local_90 = ppsVar19;
                iVar11 = iVar5;
              }
              ppsVar19 = (stbrp_node_conflict **)&psVar12->align;
              uVar1 = (ushort)(*(stbrp_context_conflict **)&psVar12->align)->width;
              psVar12 = *(stbrp_context_conflict **)&psVar12->align;
            } while ((int)(iVar21 + (uint)uVar1) <= context->width);
          }
          if (local_90 == (stbrp_node_conflict **)0x0) {
            local_94 = 0;
          }
          else {
            local_94 = (uint)(*local_90)->x;
          }
          if (context->heuristic == 1) {
            psVar12 = (stbrp_context_conflict *)*ppsVar17;
            uVar1 = (ushort)psVar12->width;
            psVar20 = psVar12;
            while ((int)(uint)uVar1 < iVar21) {
              psVar20 = *(stbrp_context_conflict **)&psVar20->align;
              uVar1 = (ushort)psVar20->width;
            }
            do {
              uVar16 = (uint)(ushort)psVar20->width - iVar21;
              ppsVar19 = ppsVar17;
              psVar4 = psVar12;
              if ((int)uVar16 < 0) {
                __assert_fail("xpos >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_rectpack.h"
                              ,0x1a8,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              do {
                psVar12 = psVar4;
                ppsVar17 = ppsVar19;
                ppsVar19 = (stbrp_node_conflict **)&psVar12->align;
                psVar4 = *(stbrp_context_conflict **)&psVar12->align;
              } while ((int)(uint)(ushort)(*(stbrp_context_conflict **)&psVar12->align)->width <=
                       (int)uVar16);
              if ((int)uVar16 < (int)(uint)(ushort)psVar12->width) {
                __assert_fail("node->next->x > xpos && node->x <= xpos",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_rectpack.h"
                              ,0x1ae,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              iVar5 = stbrp__skyline_find_min_y
                                (psVar12,(stbrp_node_conflict *)(ulong)uVar16,iVar21,(int)&local_80,
                                 (int *)in_R8);
              if ((((int)local_78 + iVar5 <= local_68->height) && (iVar5 <= iVar11)) &&
                 (((iVar5 < iVar11 || (local_80 < local_98)) ||
                  ((local_80 == local_98 && ((int)uVar16 < (int)local_94)))))) {
                local_98 = local_80;
                local_94 = uVar16;
                local_90 = ppsVar17;
                iVar11 = iVar5;
              }
              psVar20 = *(stbrp_context_conflict **)&psVar20->align;
            } while (psVar20 != (stbrp_context_conflict *)0x0);
          }
          uVar8 = CONCAT44(iVar11,local_94);
          rects = local_48;
          psVar13 = local_40;
          in_R8 = local_90;
          uVar10 = local_38;
          context = local_68;
          ppsVar17 = local_58;
          uVar18 = local_50;
        }
        if (((in_R8 == (stbrp_node_conflict **)0x0) ||
            (iVar11 = (int)local_78 + (int)((ulong)uVar8 >> 0x20), context->height < iVar11)) ||
           (psVar3 = context->free_head, psVar3 == (stbrp_node_conflict *)0x0)) {
          psVar13->x = 0xffff;
          psVar13->y = 0xffff;
        }
        else {
          psVar3->x = (stbrp_coord_conflict)uVar8;
          psVar3->y = (stbrp_coord_conflict)iVar11;
          context->free_head = psVar3->next;
          psVar15 = *in_R8;
          iVar11 = (int)uVar8;
          psVar14 = psVar15;
          if ((int)(uint)psVar15->x < iVar11) {
            psVar14 = psVar15->next;
            in_R8 = &psVar15->next;
          }
          *in_R8 = psVar3;
          if (psVar14->next != (stbrp_node_conflict *)0x0) {
            in_R8 = &psVar14->next;
            psVar15 = psVar14->next;
            do {
              if (iVar11 + (int)local_70 < (int)(uint)psVar15->x) break;
              *in_R8 = context->free_head;
              context->free_head = psVar14;
              in_R8 = &psVar15->next;
              ppsVar19 = &psVar15->next;
              psVar14 = psVar15;
              psVar15 = *ppsVar19;
            } while (*ppsVar19 != (stbrp_node_conflict *)0x0);
          }
          psVar3->next = psVar14;
          iVar11 = (int)local_70 + iVar11;
          if ((int)(uint)psVar14->x < iVar11) {
            psVar14->x = (stbrp_coord_conflict)iVar11;
          }
          psVar13->x = (stbrp_coord_conflict)uVar8;
          psVar13->y = (stbrp_coord_conflict)((ulong)uVar8 >> 0x20);
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar18);
  }
  qsort(rects,local_60,0x10,rect_original_order);
  lVar9 = extraout_RAX;
  if (0 < num_rects) {
    lVar9 = 0;
    do {
      bVar22 = true;
      if (*(short *)((long)&rects->x + lVar9) == -1) {
        bVar22 = *(short *)((long)&rects->y + lVar9) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar9) = (uint)bVar22;
      lVar9 = lVar9 + 0x10;
    } while (uVar18 * 0x10 != lVar9);
  }
  return (int)lVar9;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}